

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int lws_clean_url(char *p)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  pcVar5 = p;
  pcVar2 = p;
  if ((((*p == 'h') && (p[1] == 't')) && (p[2] == 't')) && (p[3] == 'p')) {
    pcVar1 = p + 4;
    if (p[4] == 's') {
      pcVar1 = p + 5;
    }
    pcVar5 = pcVar1;
    pcVar2 = pcVar1;
    if (p[(ulong)(p[4] == 's') + 4] == ':') {
      pcVar5 = pcVar1 + 1;
      pcVar2 = pcVar1 + 1;
      if (pcVar1[1] == '/') {
        pcVar5 = pcVar1 + 2;
        pcVar2 = pcVar1 + 2;
      }
    }
  }
LAB_001322fb:
  do {
    pcVar1 = pcVar5;
    pcVar2 = pcVar2 + 1;
    pcVar5 = pcVar1 + 1;
    while (cVar4 = *pcVar1, cVar4 == '/') {
      if (*pcVar5 != '/') goto LAB_001322fb;
      cVar4 = '/';
      pcVar3 = pcVar2;
      while (cVar4 != '\0') {
        cVar4 = *pcVar3;
        pcVar3[-1] = cVar4;
        pcVar3 = pcVar3 + 1;
      }
    }
    if (cVar4 == '\0') {
      return 0;
    }
  } while( true );
}

Assistant:

int lws_clean_url(char *p)
{
	if (p[0] == 'h' && p[1] == 't' && p[2] == 't' && p[3] == 'p') {
		p += 4;
		if (*p == 's')
		p++;
		if (*p == ':') {
			p++;
			if (*p == '/')
			p++;
		}
	}

	while (*p) {
		if (p[0] == '/' && p[1] == '/') {
			char *p1 = p;
			while (*p1) {
				*p1 = p1[1];
				p1++;
			}
			continue;
		}
		p++;
	}

	return 0;
}